

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::OrientationError::SetElevationError(OrientationError *this,KFIXED16_8 *EE)

{
  DataTypeBase local_28;
  short local_20;
  KFIXED<short,_(unsigned_char)__b_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0022a398;
  local_20 = EE->m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_18,&this->m_ElvErr);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

OrientationError::~OrientationError()
{
}